

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts3EvalPhrasePoslist(Fts3Cursor *pCsr,Fts3Expr *pExpr,int iCol,char **ppOut)

{
  byte *pbVar1;
  Fts3Phrase *pFVar2;
  sqlite3_vtab *psVar3;
  char *pBuf;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  char *pEnd;
  Fts3Expr *pFVar9;
  byte *pbVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  long lVar14;
  byte *pbVar15;
  char *pEnd_1;
  int rc;
  int iThis;
  sqlite3_int64 iDocid;
  u8 local_6d;
  int local_6c;
  byte *local_68;
  undefined8 local_60;
  byte *local_58;
  int local_4c;
  ulong local_48;
  Fts3Phrase *local_40;
  char **local_38;
  
  pFVar2 = pExpr->pPhrase;
  psVar3 = (pCsr->base).pVtab;
  *ppOut = (char *)0x0;
  if ((pFVar2->iColumn != iCol) && (pFVar2->iColumn < *(int *)&psVar3[2].pModule)) {
    return 0;
  }
  pbVar10 = (byte *)pExpr->iDocid;
  pbVar15 = (byte *)(pFVar2->doclist).pList;
  local_58 = pbVar10;
  local_4c = iCol;
  if ((pbVar10 == (byte *)pCsr->iPrevId) && (pExpr->bEof == '\0')) goto LAB_001dc805;
  local_6c = 0;
  pFVar9 = pExpr->pParent;
  if (pFVar9 == (Fts3Expr *)0x0) {
    return 0;
  }
  bVar12 = *(byte *)((long)&psVar3[0x12].zErrMsg + 7);
  bVar6 = false;
  bVar5 = false;
  do {
    if (pFVar9->eType == 4) {
      bVar5 = true;
    }
    if (pFVar9->eType == 1) {
      pExpr = pFVar9;
    }
    if (pFVar9->bEof != '\0') {
      bVar6 = true;
    }
    pFVar9 = pFVar9->pParent;
  } while (pFVar9 != (Fts3Expr *)0x0);
  if (!bVar5) {
    return 0;
  }
  local_68 = pbVar15;
  local_40 = pFVar2;
  local_38 = ppOut;
  if (pFVar2->bIncr != 0) {
    local_48 = CONCAT71(local_48._1_7_,pExpr->bEof);
    fts3EvalRestart(pCsr,pExpr,&local_6c);
    if (local_6c != 0) {
      return local_6c;
    }
    if (pExpr->bEof == '\0') {
      do {
        fts3EvalNextRow(pCsr,pExpr,&local_6c);
        if ((char)local_48 == '\0') {
          iVar7 = local_6c;
          if (((byte *)pExpr->iDocid == pbVar10) || (local_6c != 0)) goto LAB_001dc5a9;
        }
        else if (local_6c != 0) {
          return local_6c;
        }
      } while (pExpr->bEof == '\0');
    }
  }
  iVar7 = 0;
LAB_001dc5a9:
  if (iVar7 == 0 && bVar6) {
    while (pExpr->bEof == '\0') {
      fts3EvalNextRow(pCsr,pExpr,&local_6c);
      if (local_6c != 0) {
        return local_6c;
      }
    }
LAB_001dc5fd:
    pbVar15 = (byte *)0x0;
    uVar13 = 0;
LAB_001dc607:
    local_48 = uVar13;
    pFVar9 = pExpr;
    if (pExpr->eType == 1) {
      pFVar9 = pExpr->pRight;
    }
    pFVar2 = pFVar9->pPhrase;
    local_68 = (byte *)pFVar2->pOrPoslist;
    local_58 = (byte *)pFVar2->iOrDocid;
    iVar7 = (pFVar2->doclist).nAll;
    if (pCsr->bDesc != bVar12) {
      if (iVar7 == 0) {
        local_6d = '\x01';
      }
      else if (local_68 == (byte *)0x0) {
        local_6d = '\0';
      }
      else {
        local_6d = local_68 <= (pFVar2->doclist).aAll;
      }
      do {
        if (local_68 == (byte *)0x0) {
          if (local_6d != '\0') goto LAB_001dc7c4;
        }
        else {
          pbVar10 = (byte *)pCsr->iPrevId;
          lVar14 = -((long)local_58 - (long)pbVar10);
          if (bVar12 == 0) {
            lVar14 = (long)local_58 - (long)pbVar10;
          }
          if ((lVar14 < 1) || (local_6d != '\0')) goto LAB_001dc7a3;
        }
        sqlite3Fts3DoclistPrev
                  ((uint)bVar12,(pFVar2->doclist).aAll,(pFVar2->doclist).nAll,(char **)&local_68,
                   (sqlite3_int64 *)&local_58,(int *)&local_60,&local_6d);
      } while( true );
    }
    if (iVar7 == 0) {
      local_6d = '\x01';
    }
    else {
      local_6d = (pFVar2->doclist).aAll + iVar7 <= local_68;
    }
LAB_001dc666:
    if (local_68 != (byte *)0x0) {
      pbVar10 = (byte *)pCsr->iPrevId;
      lVar14 = -((long)local_58 - (long)pbVar10);
      if (bVar12 == 0) {
        lVar14 = (long)local_58 - (long)pbVar10;
      }
      if ((-1 < lVar14) || (local_6d != '\0')) goto LAB_001dc7a3;
      pbVar10 = local_68;
      bVar4 = *local_68;
      if (*local_68 != 0) {
        do {
          pbVar1 = pbVar10 + 1;
          pbVar10 = pbVar10 + 1;
          bVar11 = bVar4 & 0x80;
          bVar4 = *pbVar1;
        } while (bVar11 != 0 || *pbVar1 != 0);
      }
      do {
        pbVar1 = pbVar10 + 1;
        if ((pFVar2->doclist).aAll + (pFVar2->doclist).nAll <= pbVar1) {
          local_6d = '\x01';
          local_68 = pbVar10 + 1;
          goto LAB_001dc666;
        }
        pbVar10 = pbVar1;
      } while (*pbVar1 == 0);
      iVar7 = sqlite3Fts3GetVarint((char *)pbVar1,&local_60);
      local_68 = pbVar1 + iVar7;
      lVar14 = -CONCAT44(local_60._4_4_,(int)local_60);
      if (bVar12 == 0) {
        lVar14 = CONCAT44(local_60._4_4_,(int)local_60);
      }
      local_58 = local_58 + lVar14;
      goto LAB_001dc666;
    }
    if (local_6d == '\0') {
      pBuf = (pFVar2->doclist).aAll;
      iVar7 = sqlite3Fts3GetVarint(pBuf,(sqlite_int64 *)&local_58);
      local_68 = (byte *)(pBuf + iVar7);
      goto LAB_001dc666;
    }
LAB_001dc7c4:
    pFVar2->pOrPoslist = (char *)0x0;
    pFVar2->iOrDocid = (i64)local_58;
    local_68 = local_58;
    goto LAB_001dc7d5;
  }
  if (iVar7 != 0) {
    return iVar7;
  }
  if (pExpr != (Fts3Expr *)0x0) goto LAB_001dc5fd;
LAB_001dc7f2:
  pbVar15 = (byte *)local_40->pOrPoslist;
  ppOut = local_38;
LAB_001dc805:
  iVar7 = local_4c;
  if (pbVar15 != (byte *)0x0) {
    if (*pbVar15 == 1) {
      pbVar10 = pbVar15 + 1;
      if ((char)pbVar15[1] < '\0') {
        local_68 = pbVar10;
        uVar8 = sqlite3Fts3GetVarint32((char *)pbVar10,(int *)&local_60);
        uVar13 = (ulong)uVar8;
      }
      else {
        uVar13 = 1;
        local_60._0_4_ = (int)(char)pbVar15[1];
      }
      pbVar15 = pbVar10 + uVar13;
    }
    else {
      local_60._0_4_ = 0;
    }
    if ((int)local_60 < iVar7) {
      do {
        bVar12 = *pbVar15;
        if (1 < bVar12) {
          do {
            bVar4 = bVar12 & 0x80;
            bVar12 = pbVar15[1];
            pbVar15 = pbVar15 + 1;
          } while ((bVar12 & 0xfe) != 0 || bVar4 != 0);
        }
        if (bVar12 == 0) {
          return 0;
        }
        pbVar10 = pbVar15 + 1;
        if ((char)pbVar15[1] < '\0') {
          local_68 = pbVar10;
          uVar8 = sqlite3Fts3GetVarint32((char *)pbVar10,(int *)&local_60);
          uVar13 = (ulong)uVar8;
        }
        else {
          uVar13 = 1;
          local_60._0_4_ = (int)(char)pbVar15[1];
        }
        pbVar15 = pbVar10 + uVar13;
      } while ((int)local_60 < iVar7);
    }
    if (*pbVar15 == 0) {
      pbVar15 = (byte *)0x0;
    }
    if ((int)local_60 != iVar7) {
      pbVar15 = (byte *)0x0;
    }
    *ppOut = (char *)pbVar15;
  }
  return 0;
LAB_001dc7a3:
  pFVar2->pOrPoslist = (char *)local_68;
  pFVar2->iOrDocid = (i64)local_58;
  if ((local_6d != '\0') || (local_58 != pbVar10)) {
LAB_001dc7d5:
    pExpr = pExpr->pLeft;
    ppOut = local_38;
    uVar13 = CONCAT71((int7)((ulong)local_68 >> 8),1);
    if (pExpr == (Fts3Expr *)0x0) goto LAB_001dc805;
    goto LAB_001dc607;
  }
  pExpr = pExpr->pLeft;
  uVar13 = local_48;
  if (pExpr == (Fts3Expr *)0x0) goto LAB_001dc7e6;
  goto LAB_001dc607;
LAB_001dc7e6:
  if ((local_48 & 1) != 0) {
    pbVar15 = (byte *)0x0;
    ppOut = local_38;
    goto LAB_001dc805;
  }
  goto LAB_001dc7f2;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalPhrasePoslist(
  Fts3Cursor *pCsr,               /* FTS3 cursor object */
  Fts3Expr *pExpr,                /* Phrase to return doclist for */
  int iCol,                       /* Column to return position list for */
  char **ppOut                    /* OUT: Pointer to position list */
){
  Fts3Phrase *pPhrase = pExpr->pPhrase;
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  char *pIter;
  int iThis;
  sqlite3_int64 iDocid;

  /* If this phrase is applies specifically to some column other than 
  ** column iCol, return a NULL pointer.  */
  *ppOut = 0;
  assert( iCol>=0 && iCol<pTab->nColumn );
  if( (pPhrase->iColumn<pTab->nColumn && pPhrase->iColumn!=iCol) ){
    return SQLITE_OK;
  }

  iDocid = pExpr->iDocid;
  pIter = pPhrase->doclist.pList;
  if( iDocid!=pCsr->iPrevId || pExpr->bEof ){
    int rc = SQLITE_OK;
    int bDescDoclist = pTab->bDescIdx;      /* For DOCID_CMP macro */
    int bOr = 0;
    u8 bTreeEof = 0;
    Fts3Expr *p;                  /* Used to iterate from pExpr to root */
    Fts3Expr *pNear;              /* Most senior NEAR ancestor (or pExpr) */
    int bMatch;

    /* Check if this phrase descends from an OR expression node. If not, 
    ** return NULL. Otherwise, the entry that corresponds to docid 
    ** pCsr->iPrevId may lie earlier in the doclist buffer. Or, if the
    ** tree that the node is part of has been marked as EOF, but the node
    ** itself is not EOF, then it may point to an earlier entry. */
    pNear = pExpr;
    for(p=pExpr->pParent; p; p=p->pParent){
      if( p->eType==FTSQUERY_OR ) bOr = 1;
      if( p->eType==FTSQUERY_NEAR ) pNear = p;
      if( p->bEof ) bTreeEof = 1;
    }
    if( bOr==0 ) return SQLITE_OK;

    /* This is the descendent of an OR node. In this case we cannot use
    ** an incremental phrase. Load the entire doclist for the phrase
    ** into memory in this case.  */
    if( pPhrase->bIncr ){
      int bEofSave = pNear->bEof;
      fts3EvalRestart(pCsr, pNear, &rc);
      while( rc==SQLITE_OK && !pNear->bEof ){
        fts3EvalNextRow(pCsr, pNear, &rc);
        if( bEofSave==0 && pNear->iDocid==iDocid ) break;
      }
      assert( rc!=SQLITE_OK || pPhrase->bIncr==0 );
    }
    if( bTreeEof ){
      while( rc==SQLITE_OK && !pNear->bEof ){
        fts3EvalNextRow(pCsr, pNear, &rc);
      }
    }
    if( rc!=SQLITE_OK ) return rc;

    bMatch = 1;
    for(p=pNear; p; p=p->pLeft){
      u8 bEof = 0;
      Fts3Expr *pTest = p;
      Fts3Phrase *pPh;
      assert( pTest->eType==FTSQUERY_NEAR || pTest->eType==FTSQUERY_PHRASE );
      if( pTest->eType==FTSQUERY_NEAR ) pTest = pTest->pRight;
      assert( pTest->eType==FTSQUERY_PHRASE );
      pPh = pTest->pPhrase;

      pIter = pPh->pOrPoslist;
      iDocid = pPh->iOrDocid;
      if( pCsr->bDesc==bDescDoclist ){
        bEof = !pPh->doclist.nAll ||
          (pIter >= (pPh->doclist.aAll + pPh->doclist.nAll));
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)<0 ) && bEof==0 ){
          sqlite3Fts3DoclistNext(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll, 
              &pIter, &iDocid, &bEof
          );
        }
      }else{
        bEof = !pPh->doclist.nAll || (pIter && pIter<=pPh->doclist.aAll);
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)>0 ) && bEof==0 ){
          int dummy;
          sqlite3Fts3DoclistPrev(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll, 
              &pIter, &iDocid, &dummy, &bEof
              );
        }
      }
      pPh->pOrPoslist = pIter;
      pPh->iOrDocid = iDocid;
      if( bEof || iDocid!=pCsr->iPrevId ) bMatch = 0;
    }

    if( bMatch ){
      pIter = pPhrase->pOrPoslist;
    }else{
      pIter = 0;
    }
  }
  if( pIter==0 ) return SQLITE_OK;

  if( *pIter==0x01 ){
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }else{
    iThis = 0;
  }
  while( iThis<iCol ){
    fts3ColumnlistCopy(0, &pIter);
    if( *pIter==0x00 ) return SQLITE_OK;
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }
  if( *pIter==0x00 ){
    pIter = 0;
  }

  *ppOut = ((iCol==iThis)?pIter:0);
  return SQLITE_OK;
}